

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

bool compareProvisioningTeams(QVariantMap *a,QVariantMap *b)

{
  byte bVar1;
  byte bVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QArrayDataPointer<char16_t> local_90;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QtPrivate::lengthHelperPointer<char>("isFreeProvisioningTeam");
  latin1.m_data = "isFreeProvisioningTeam";
  latin1.m_size = qVar3;
  QString::QString((QString *)&local_90,latin1);
  local_78._16_8_ = 0;
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_60 = 2;
  QMap<QString,_QVariant>::value(&local_58,a,(QString *)&local_90,(QVariant *)&local_78);
  bVar1 = QVariant::toBool();
  QVariant::~QVariant(&local_58);
  QVariant::~QVariant((QVariant *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  latin1_00.m_data = "isFreeProvisioningTeam";
  latin1_00.m_size = qVar3;
  QString::QString((QString *)&local_90,latin1_00);
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  local_60 = 2;
  QMap<QString,_QVariant>::value(&local_58,b,(QString *)&local_90,(QVariant *)&local_78);
  bVar2 = QVariant::toBool();
  QVariant::~QVariant(&local_58);
  QVariant::~QVariant((QVariant *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar2 & (bVar1 ^ 1));
  }
  __stack_chk_fail();
}

Assistant:

static bool compareProvisioningTeams(const QVariantMap &a, const QVariantMap &b)
{
    int aFree = a.value(QLatin1String("isFreeProvisioningTeam")).toBool() ? 1 : 0;
    int bFree = b.value(QLatin1String("isFreeProvisioningTeam")).toBool() ? 1 : 0;
    return aFree < bFree;
}